

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

void __thiscall amrex::BoxArray::removeOverlap(BoxArray *this,bool simplify)

{
  pointer *ppBVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  iterator __position;
  ulong uVar5;
  iterator __position_00;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  uint uVar10;
  long lVar11;
  mapped_type *this_00;
  Box *b;
  Box *pBVar12;
  pointer pBVar13;
  uint uVar14;
  IndexType _btype;
  pointer pBVar15;
  BoxArray *pBVar16;
  uint uVar17;
  ulong uVar18;
  BoxArray *pBVar19;
  ulong uVar20;
  Box *b_1;
  ulong uVar21;
  byte bVar22;
  IntVect IVar23;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxList bl;
  BoxList bl_diff;
  BoxArray nba;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_f8;
  BoxList local_d8;
  BoxList local_b8;
  BoxArray local_98;
  
  bVar22 = 0;
  lVar11 = 4;
  switch((this->m_bat).m_bat_type) {
  default:
    lVar11 = 8;
  case indexType:
  case indexType_coarsenRatio:
    if (*(int *)((long)&(this->m_bat).m_bat_type + lVar11) != 0) {
      Abort_host("BoxArray::removeOverlap() supports cell-centered only");
    }
  case null:
  case coarsenRatio:
    IVar23 = BATransformer::coarsen_ratio(&this->m_bat);
    if (IVar23.vect[2] != 1 || IVar23.vect._0_8_ != 0x100000001) {
      Abort_host("BoxArray::removeOverlap() must have m_crse_ratio == 1");
    }
    uniqify(this);
    peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BoxList::BoxList(&local_b8);
    peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pBVar15 = (peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start;
    pBVar13 = *(pointer *)
               ((long)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data + 8);
    if (pBVar13 != pBVar15 && -1 < (long)pBVar13 - (long)pBVar15) {
      uVar20 = 0;
      do {
        if ((((pBVar15[uVar20].smallend.vect[0] <= pBVar15[uVar20].bigend.vect[0]) &&
             (pBVar12 = pBVar15 + uVar20, (pBVar12->smallend).vect[1] <= (pBVar12->bigend).vect[1]))
            && ((pBVar12->smallend).vect[2] <= (pBVar12->bigend).vect[2])) &&
           ((pBVar12->btype).itype < 8)) {
          local_98.m_bat._0_8_ = 0;
          local_98.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
          intersections(this,pBVar12,&local_f8,false,(IntVect *)&local_98);
          uVar10 = (uint)((ulong)((long)local_f8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_f8.
                                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5);
          if (0 < (int)uVar10) {
            uVar21 = 0;
            do {
              if (uVar20 != (uint)local_f8.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar21].first) {
                pBVar12 = (Box *)((long)local_f8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar21].first *
                                  0x1c + *(long *)&(((this->m_ref).
                                                                                                          
                                                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->m_abox).
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data);
                boxDiff(&local_b8,pBVar12,
                        &local_f8.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar21].second);
                pBVar15 = local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                (pBVar12->smallend).vect[0] = 1;
                (pBVar12->smallend).vect[1] = 1;
                (pBVar12->smallend).vect[2] = 1;
                (pBVar12->bigend).vect[0] = 0;
                (pBVar12->bigend).vect[1] = 0;
                *(undefined8 *)((pBVar12->bigend).vect + 2) = 0;
                for (pBVar13 = local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                               .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_start; pBVar13 != pBVar15;
                    pBVar13 = pBVar13 + 1) {
                  peVar4 = (this->m_ref).
                           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  __position._M_current =
                       *(pointer *)
                        ((long)&(peVar4->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8);
                  if (__position._M_current ==
                      *(pointer *)
                       ((long)&(peVar4->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 0x10)) {
                    std::vector<amrex::Box,std::allocator<amrex::Box>>::
                    _M_realloc_insert<amrex::Box_const&>
                              ((vector<amrex::Box,std::allocator<amrex::Box>> *)peVar4,__position,
                               pBVar13);
                  }
                  else {
                    uVar6 = *(undefined8 *)(pBVar13->smallend).vect;
                    uVar7 = *(undefined8 *)((pBVar13->smallend).vect + 2);
                    uVar8 = *(undefined8 *)((pBVar13->bigend).vect + 2);
                    *(undefined8 *)((__position._M_current)->bigend).vect =
                         *(undefined8 *)(pBVar13->bigend).vect;
                    *(undefined8 *)(((__position._M_current)->bigend).vect + 2) = uVar8;
                    *(undefined8 *)((__position._M_current)->smallend).vect = uVar6;
                    *(undefined8 *)(((__position._M_current)->smallend).vect + 2) = uVar7;
                    ppBVar1 = (pointer *)
                              ((long)&(peVar4->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data + 8);
                    *ppBVar1 = *ppBVar1 + 1;
                  }
                  peVar4 = (this->m_ref).
                           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  uVar5 = *(ulong *)(pBVar13->smallend).vect;
                  local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                       (IndexType)(pBVar13->smallend).vect[2];
                  iVar2 = (peVar4->crsn).vect[0];
                  uVar14 = (uint)uVar5;
                  if (iVar2 != 1) {
                    if (iVar2 == 4) {
                      if ((int)uVar14 < 0) {
                        uVar14 = (int)uVar14 >> 2;
                      }
                      else {
                        uVar14 = uVar14 >> 2;
                      }
                    }
                    else if (iVar2 == 2) {
                      if ((int)uVar14 < 0) {
                        uVar14 = (int)uVar14 >> 1;
                      }
                      else {
                        uVar14 = uVar14 >> 1;
                      }
                    }
                    else if ((int)uVar14 < 0) {
                      uVar14 = ~((int)~uVar14 / iVar2);
                    }
                    else {
                      uVar14 = (uint)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                            uVar5 & 0xffffffff) / (long)iVar2);
                    }
                  }
                  uVar18 = uVar5 >> 0x20;
                  iVar2 = (peVar4->crsn).vect[1];
                  if (iVar2 != 1) {
                    uVar17 = (uint)(uVar5 >> 0x20);
                    if (iVar2 == 4) {
                      if ((long)uVar5 < 0) {
                        uVar18 = (ulong)(uint)((int)uVar17 >> 2);
                      }
                      else {
                        uVar18 = (ulong)(uVar17 >> 2);
                      }
                    }
                    else if (iVar2 == 2) {
                      if ((long)uVar5 < 0) {
                        uVar18 = (ulong)(uint)((int)uVar17 >> 1);
                      }
                      else {
                        uVar18 = (ulong)(uVar17 >> 1);
                      }
                    }
                    else if ((long)uVar5 < 0) {
                      uVar18 = (ulong)(uint)~((int)~uVar17 / iVar2);
                    }
                    else {
                      uVar18 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar18) /
                               (long)iVar2 & 0xffffffff;
                    }
                  }
                  iVar2 = (peVar4->crsn).vect[2];
                  if (iVar2 != 1) {
                    if (iVar2 == 4) {
                      if ((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                        local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                             (IndexType)((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype >> 2);
                      }
                      else {
                        local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                             (IndexType)((uint)local_98.m_bat.m_op.m_bndryReg.m_typ.itype >> 2);
                      }
                    }
                    else if (iVar2 == 2) {
                      if ((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                        local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                             (IndexType)((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype >> 1);
                      }
                      else {
                        local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                             (IndexType)((uint)local_98.m_bat.m_op.m_bndryReg.m_typ.itype >> 1);
                      }
                    }
                    else if ((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype < 0) {
                      local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                           (IndexType)
                           ~((int)~(uint)local_98.m_bat.m_op.m_bndryReg.m_typ.itype / iVar2);
                    }
                    else {
                      local_98.m_bat.m_op.m_bndryReg.m_typ.itype =
                           (IndexType)((int)local_98.m_bat.m_op.m_bndryReg.m_typ.itype / iVar2);
                    }
                  }
                  local_98.m_bat._0_8_ = (ulong)uVar14 | uVar18 << 0x20;
                  this_00 = std::__detail::
                            _Map_base<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&peVar3->hash,(key_type *)&local_98);
                  peVar4 = (this->m_ref).
                           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ =
                       (int)((ulong)((long)*(pointer *)
                                            ((long)&(peVar4->m_abox).
                                                                                                        
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                    *(long *)&(peVar4->m_abox).
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data) >> 2) * -0x49249249
                       + -1;
                  __position_00._M_current =
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position_00._M_current ==
                      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (this_00,__position_00,(int *)&local_d8);
                  }
                  else {
                    *__position_00._M_current =
                         (int)local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
                  }
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != (uVar10 & 0x7fffffff));
          }
        }
        uVar20 = uVar20 + 1;
        peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pBVar15 = (peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar11 = ((long)*(pointer *)
                         ((long)&(peVar4->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data + 8) - (long)pBVar15 >> 2) *
                 0x6db6db6db6db6db7;
      } while (lVar11 - uVar20 != 0 && (long)uVar20 <= lVar11);
    }
    _btype.itype = 0;
    switch((this->m_bat).m_bat_type) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      _btype.itype = (this->m_bat).m_op.m_indexType.m_typ.itype;
      break;
    default:
      _btype.itype = (this->m_bat).m_op.m_bndryReg.m_typ.itype;
    }
    BoxList::BoxList(&local_d8,_btype);
    peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pBVar15 = (peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start;
    pBVar13 = *(pointer *)
               ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data + 8);
    if (pBVar15 != pBVar13) {
      do {
        if ((((pBVar15->smallend).vect[0] <= (pBVar15->bigend).vect[0]) &&
            ((pBVar15->smallend).vect[1] <= (pBVar15->bigend).vect[1])) &&
           (((pBVar15->smallend).vect[2] <= (pBVar15->bigend).vect[2] &&
            ((pBVar15->btype).itype < 8)))) {
          if (local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                      ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_d8,
                       (iterator)
                       local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish,pBVar15);
          }
          else {
            uVar6 = *(undefined8 *)(pBVar15->smallend).vect;
            uVar7 = *(undefined8 *)((pBVar15->smallend).vect + 2);
            uVar8 = *(undefined8 *)((pBVar15->bigend).vect + 2);
            *(undefined8 *)
             ((local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish)->bigend).vect =
                 *(undefined8 *)(pBVar15->bigend).vect;
            *(undefined8 *)
             (((local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish)->bigend).vect + 2) = uVar8;
            *(undefined8 *)
             ((local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish)->smallend).vect = uVar6;
            *(undefined8 *)
             (((local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish)->smallend).vect + 2) = uVar7;
            local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        pBVar15 = pBVar15 + 1;
      } while (pBVar15 != pBVar13);
    }
    if (simplify) {
      BoxList::simplify(&local_d8,false);
    }
    BoxArray(&local_98,&local_d8);
    pBVar16 = &local_98;
    pBVar19 = this;
    for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
      *(undefined8 *)&pBVar19->m_bat = *(undefined8 *)&pBVar16->m_bat;
      pBVar16 = (BoxArray *)((long)pBVar16 + (ulong)bVar22 * -0x10 + 8);
      pBVar19 = (BoxArray *)((long)pBVar19 + (ulong)bVar22 * -0x10 + 8);
    }
    (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_98.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_simplified_list).
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_98.m_simplified_list.
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ~BoxArray(&local_98);
    pvVar9 = (void *)CONCAT44(local_d8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)local_d8.m_lbox.
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    if (pvVar9 != (void *)0x0) {
      operator_delete(pvVar9,(long)local_d8.m_lbox.
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar9)
      ;
    }
    if (local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start != (Box *)0x0) {
      operator_delete(local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f8.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
}

Assistant:

void
BoxArray::removeOverlap (bool simplify)
{
    if (! ixType().cellCentered()) {
        amrex::Abort("BoxArray::removeOverlap() supports cell-centered only");
    }

    if (crseRatio() != IntVect::TheUnitVector()) {
        amrex::Abort("BoxArray::removeOverlap() must have m_crse_ratio == 1");
    }

    uniqify();

    BARef::HashType& BoxHashMap = m_ref->hash;

    const Box EmptyBox;

    std::vector< std::pair<int,Box> > isects;
    //
    // Note that "size()" can increase in this loop!!!
    //
#ifdef AMREX_MEM_PROFILING
    m_ref->updateMemoryUsage_box(-1);
    m_ref->updateMemoryUsage_hash(-1);
    Long total_hash_bytes_save = m_ref->total_hash_bytes;
#endif

    BoxList bl_diff;

    for (int i = 0; i < size(); i++)
    {
        if (m_ref->m_abox[i].ok())
        {
            intersections(m_ref->m_abox[i],isects);

            for (int j = 0, N = isects.size(); j < N; j++)
            {
                if (isects[j].first == i) continue;

                Box& bx = m_ref->m_abox[isects[j].first];

                amrex::boxDiff(bl_diff, bx, isects[j].second);

                bx = EmptyBox;

                for (const Box& b : bl_diff)
                {
                    m_ref->m_abox.push_back(b);
                    BoxHashMap[amrex::coarsen(b.smallEnd(),m_ref->crsn)].push_back(size()-1);
                }
            }
        }
    }
#ifdef AMREX_MEM_PROFILING
    m_ref->updateMemoryUsage_box(1);
#endif
    //
    // We now have "holes" in our BoxArray. Make us good.
    //
    BoxList bl(ixType());
    for (const auto& b : m_ref->m_abox) {
        if (b.ok()) {
            bl.push_back(b);
        }
    }

    if (simplify) {
        bl.simplify();
    }

    BoxArray nba(std::move(bl));

    *this = nba;

#ifdef AMREX_MEM_PROFILING
    m_ref->total_hash_bytes = total_hash_bytes_save;
#endif

    BL_ASSERT(isDisjoint());
}